

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::PatternMatchesString(string *name_str,char *pattern,char *pattern_end)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *local_50;
  char *name_next;
  char *pattern_next;
  char *name_end;
  char *name_begin;
  char *name;
  char *pattern_end_local;
  char *pattern_local;
  string *name_str_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::size();
  pcVar3 = pcVar1 + lVar2;
  local_50 = pcVar1;
  name_next = pattern;
  name_begin = pcVar1;
  pattern_end_local = pattern;
LAB_006bacc8:
  do {
    while( true ) {
      if (pattern_end <= pattern_end_local && pcVar3 <= name_begin) {
        return true;
      }
      if (pattern_end_local < pattern_end) break;
LAB_006bada5:
      if ((local_50 <= pcVar1) || (pcVar3 < local_50)) {
        return false;
      }
      pattern_end_local = name_next;
      name_begin = local_50;
    }
    if (*pattern_end_local == '*') {
      name_next = pattern_end_local;
      local_50 = name_begin + 1;
      pattern_end_local = pattern_end_local + 1;
      goto LAB_006bacc8;
    }
    if (*pattern_end_local == '?') {
      if (pcVar3 <= name_begin) goto LAB_006bada5;
      pattern_end_local = pattern_end_local + 1;
      name_begin = name_begin + 1;
    }
    else {
      if ((pcVar3 <= name_begin) || (*name_begin != *pattern_end_local)) goto LAB_006bada5;
      pattern_end_local = pattern_end_local + 1;
      name_begin = name_begin + 1;
    }
  } while( true );
}

Assistant:

static bool PatternMatchesString(const std::string& name_str,
                                 const char* pattern, const char* pattern_end) {
  const char* name = name_str.c_str();
  const char* const name_begin = name;
  const char* const name_end = name + name_str.size();

  const char* pattern_next = pattern;
  const char* name_next = name;

  while (pattern < pattern_end || name < name_end) {
    if (pattern < pattern_end) {
      switch (*pattern) {
        default:  // Match an ordinary character.
          if (name < name_end && *name == *pattern) {
            ++pattern;
            ++name;
            continue;
          }
          break;
        case '?':  // Match any single character.
          if (name < name_end) {
            ++pattern;
            ++name;
            continue;
          }
          break;
        case '*':
          // Match zero or more characters. Start by skipping over the wildcard
          // and matching zero characters from name. If that fails, restart and
          // match one more character than the last attempt.
          pattern_next = pattern;
          name_next = name + 1;
          ++pattern;
          continue;
      }
    }
    // Failed to match a character. Restart if possible.
    if (name_begin < name_next && name_next <= name_end) {
      pattern = pattern_next;
      name = name_next;
      continue;
    }
    return false;
  }
  return true;
}